

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word.c
# Opt level: O0

int lowerword(int f,int n)

{
  byte bVar1;
  int iVar2;
  RSIZE size_00;
  int iVar3;
  RSIZE size;
  int s;
  int c;
  int n_local;
  int f_local;
  
  n_local = checkdirty(curbp);
  if (n_local == 1) {
    if ((curbp->b_flag & 0x10U) == 0) {
      s = n;
      if (n < 0) {
        n_local = 0;
      }
      else {
        while (iVar3 = s + -1, s != 0) {
          while (iVar2 = inword(), iVar2 == 0) {
            iVar2 = forwchar(8,1);
            if (iVar2 == 0) {
              return 1;
            }
          }
          size_00 = countfword();
          undo_add_change(curwp->w_dotp,curwp->w_doto,size_00);
          while (iVar2 = inword(), s = iVar3, iVar2 != 0) {
            bVar1 = curwp->w_dotp->l_text[curwp->w_doto];
            if ((cinfo[bVar1] & 2U) != 0) {
              curwp->w_dotp->l_text[curwp->w_doto] = bVar1 + 0x20;
              lchange(8);
            }
            iVar2 = forwchar(8,1);
            if (iVar2 == 0) {
              return 1;
            }
          }
        }
        n_local = 1;
      }
    }
    else {
      dobeep();
      ewprintf("Buffer is read-only");
      n_local = 0;
    }
  }
  return n_local;
}

Assistant:

int
lowerword(int f, int n)
{
	int	c, s;
	RSIZE	size;

	if ((s = checkdirty(curbp)) != TRUE)
		return (s);
	if (curbp->b_flag & BFREADONLY) {
		dobeep();
		ewprintf("Buffer is read-only");
		return (FALSE);
	}
	if (n < 0)
		return (FALSE);
	while (n--) {
		while (inword() == FALSE) {
			if (forwchar(FFRAND, 1) == FALSE)
				return (TRUE);
		}
		size = countfword();
		undo_add_change(curwp->w_dotp, curwp->w_doto, size);

		while (inword() != FALSE) {
			c = lgetc(curwp->w_dotp, curwp->w_doto);
			if (ISUPPER(c) != FALSE) {
				c = TOLOWER(c);
				lputc(curwp->w_dotp, curwp->w_doto, c);
				lchange(WFFULL);
			}
			if (forwchar(FFRAND, 1) == FALSE)
				return (TRUE);
		}
	}
	return (TRUE);
}